

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-feat.c
# Opt level: O3

void project_feature_handler_LIGHT_WEAK(project_feature_handler_context_t *context)

{
  uint32_t *puVar1;
  loc grid;
  player *ppVar2;
  _Bool _Var3;
  square *psVar4;
  
  grid = context->grid;
  psVar4 = square(cave,grid);
  flag_on_dbg(psVar4->info,3,2,"square(cave, grid)->info","SQUARE_GLOW");
  _Var3 = square_isview(cave,grid);
  ppVar2 = player;
  if (_Var3) {
    if (player->timed[2] == 0) {
      context->obvious = true;
    }
    puVar1 = &ppVar2->upkeep->update;
    *puVar1 = *puVar1 | 0xc0;
  }
  return;
}

Assistant:

static void project_feature_handler_LIGHT_WEAK(project_feature_handler_context_t *context)
{
	const struct loc grid = context->grid;

	/* Turn on the light */
	sqinfo_on(square(cave, grid)->info, SQUARE_GLOW);

	/* Grid is in line of sight */
	if (square_isview(cave, grid)) {
		if (!player->timed[TMD_BLIND]) {
			/* Observe */
			context->obvious = true;
		}

		/* Fully update the visuals */
		player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);
	}
}